

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell::
~TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell
          (TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell *this)

{
  TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell *this_local;
  
  ~TEST_MockComparatorCopierTest_shouldSupportConstParameters_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, shouldSupportConstParameters)
{
    StubComparator comparator;
    mock().installComparator("SomeClass", comparator);

    SomeClass param;
    mock().expectOneCall("functionWithConstParam").withParameterOfType("SomeClass", "param", &param);
    functionWithConstParam(param);

    mock().checkExpectations();
}